

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXProperties.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::PropertyTable::PropertyTable
          (PropertyTable *this,Element *element,
          shared_ptr<const_Assimp::FBX::PropertyTable> *templateProps)

{
  _Rb_tree_header *p_Var1;
  undefined8 *puVar2;
  mapped_type pEVar3;
  bool bVar4;
  Scope *pSVar5;
  iterator iVar6;
  mapped_type *ppEVar7;
  _Base_ptr p_Var8;
  Token *t;
  _Rb_tree_node_base *p_Var9;
  allocator<char> local_89;
  PropertyTable *local_88;
  _Rb_tree_node_base *local_80;
  _Base_ptr local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_78 = &(this->lazyProps)._M_t._M_impl.super__Rb_tree_header._M_header;
  (this->lazyProps)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->lazyProps)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->lazyProps)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_78;
  (this->lazyProps)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_78;
  (this->lazyProps)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->props)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->props)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->props)._M_t._M_impl.super__Rb_tree_header;
  (this->props)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->props)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->props)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->templateProps).
              super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>,
             &templateProps->
              super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>);
  this->element = element;
  local_88 = this;
  pSVar5 = GetRequiredScope(element);
  p_Var8 = (pSVar5->elements)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var9 = &(pSVar5->elements)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_80 = p_Var9;
  do {
    if (p_Var8 == p_Var9) {
      return;
    }
    bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (p_Var8 + 1),"P");
    if (bVar4) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"expected only P elements in property table",
                 (allocator<char> *)&local_70);
      Util::DOMWarning(&local_50,*(Element **)(p_Var8 + 2));
    }
    else {
      puVar2 = *(undefined8 **)(*(long *)(p_Var8 + 2) + 8);
      if ((ulong)(*(long *)(*(long *)(p_Var8 + 2) + 0x10) - (long)puVar2) < 0x20) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"",(allocator<char> *)&local_70);
      }
      else {
        ParseTokenAsString_abi_cxx11_(&local_50,(FBX *)*puVar2,t);
      }
      if (local_50._M_string_length == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,"could not read property name",&local_89);
        Util::DOMWarning(&local_70,*(Element **)(p_Var8 + 2));
      }
      else {
        iVar6 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Element_*>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Element_*>_>_>
                        *)local_88,&local_50);
        if (iVar6._M_node == local_78) {
          pEVar3 = *(mapped_type *)(p_Var8 + 2);
          ppEVar7 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Element_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Element_*>_>_>
                    ::operator[](&local_88->lazyProps,&local_50);
          *ppEVar7 = pEVar3;
          p_Var9 = local_80;
          goto LAB_004b1d2a;
        }
        std::operator+(&local_70,"duplicate property name, will hide previous value: ",&local_50);
        Util::DOMWarning(&local_70,*(Element **)(p_Var8 + 2));
      }
      std::__cxx11::string::~string((string *)&local_70);
    }
LAB_004b1d2a:
    std::__cxx11::string::~string((string *)&local_50);
    p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
  } while( true );
}

Assistant:

PropertyTable::PropertyTable(const Element& element, std::shared_ptr<const PropertyTable> templateProps)
: templateProps(templateProps)
, element(&element)
{
    const Scope& scope = GetRequiredScope(element);
    for(const ElementMap::value_type& v : scope.Elements()) {
        if(v.first != "P") {
            DOMWarning("expected only P elements in property table",v.second);
            continue;
        }

        const std::string& name = PeekPropertyName(*v.second);
        if(!name.length()) {
            DOMWarning("could not read property name",v.second);
            continue;
        }

        LazyPropertyMap::const_iterator it = lazyProps.find(name);
        if (it != lazyProps.end()) {
            DOMWarning("duplicate property name, will hide previous value: " + name,v.second);
            continue;
        }

        lazyProps[name] = v.second;
    }
}